

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test::TestBody
          (ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test *this)

{
  char *pcVar1;
  AssertHelper local_190;
  AssertHelper local_188;
  AssertionResult gtest_ar_;
  _Storage<bidfx_public_api::price::pixie::FieldDef,_false> local_170;
  byte local_140;
  FieldDef endSize;
  string local_130 [40];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  FieldDef local_a8 [8];
  string local_a0 [40];
  ExtendableDataDictionary extendable_data_dictionary1;
  
  CreateExtendableDataDictionary();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"EndSize",(allocator<char> *)&local_170._M_value);
  pcVar1 = (char *)0x1;
  bidfx_public_api::price::pixie::FieldDef::FieldDef(&endSize,5000,0x4c,local_c8,0x31);
  std::__cxx11::string::~string(local_c8);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid((int)&local_170);
  gtest_ar_.success_ = (bool)(local_140 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)&local_170._M_value
            );
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_170._M_value,(internal *)&gtest_ar_,
               (AssertionResult *)"extendable_data_dictionary1.FieldDefByFid(endSize.fid_)","true",
               "false",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x71,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string(local_e8,local_130);
    bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
              (&local_170,&extendable_data_dictionary1,local_e8);
    gtest_ar_.success_ = (bool)(local_140 ^ 1);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
              ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)
               &local_170._M_value);
    std::__cxx11::string::~string(local_e8);
    if (gtest_ar_.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      bidfx_public_api::price::pixie::FieldDef::FieldDef(local_a8,&endSize);
      bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
                (&extendable_data_dictionary1,local_a8);
      std::__cxx11::string::~string(local_a0);
      bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid((int)&local_170);
      testing::internal::
      CmpHelperEQ<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
                ((internal *)&gtest_ar_,"endSize",
                 "extendable_data_dictionary1.FieldDefByFid(endSize.fid_)",&endSize,
                 (optional<bidfx_public_api::price::pixie::FieldDef> *)&local_170._M_value);
      std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
                ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)
                 &local_170._M_value);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_170._M_value);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                   ,0x74,pcVar1);
        testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_170._M_value);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_170._M_value);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        std::__cxx11::string::string(local_108,local_130);
        bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
                  (&local_170,&extendable_data_dictionary1,local_108);
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
                  ((internal *)&gtest_ar_,"endSize",
                   "extendable_data_dictionary1.FieldDefByName(endSize.name_)",&endSize,
                   (optional<bidfx_public_api::price::pixie::FieldDef> *)&local_170._M_value);
        std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
                  ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)
                   &local_170._M_value);
        std::__cxx11::string::~string(local_108);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_170._M_value);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0x75,pcVar1);
          testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_170._M_value);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_170._M_value);
        }
      }
      goto LAB_00169dc7;
    }
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_170._M_value,(internal *)&gtest_ar_,
               (AssertionResult *)"extendable_data_dictionary1.FieldDefByName(endSize.name_)","true"
               ,"false",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x72,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_188);
  std::__cxx11::string::~string((string *)&local_170._M_value);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190);
LAB_00169dc7:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string(local_130);
  ExtendableDataDictionary::~ExtendableDataDictionary(&extendable_data_dictionary1);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary)
{
    ExtendableDataDictionary extendable_data_dictionary1 = CreateExtendableDataDictionary();
    FieldDef endSize(5000, FieldTypeEnum::LONG, "EndSize", FieldEncodingEnum::FIXED1, 1);
    ASSERT_FALSE(extendable_data_dictionary1.FieldDefByFid(endSize.fid_));
    ASSERT_FALSE(extendable_data_dictionary1.FieldDefByName(endSize.name_));
    extendable_data_dictionary1.AddFieldDef(endSize);
    ASSERT_EQ(endSize, extendable_data_dictionary1.FieldDefByFid(endSize.fid_));
    ASSERT_EQ(endSize, extendable_data_dictionary1.FieldDefByName(endSize.name_));
}